

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_datarate_test.cc
# Opt level: O2

void __thiscall
datarate_test::(anonymous_namespace)::DatarateTestSVC_BasicRateTargetingFixedModeSVC3TL3SLHD_Test::
~DatarateTestSVC_BasicRateTargetingFixedModeSVC3TL3SLHD_Test
          (DatarateTestSVC_BasicRateTargetingFixedModeSVC3TL3SLHD_Test *this)

{
  anon_unknown_0::DatarateTestSVC_BasicRateTargetingFixedModeSVC3TL3SLHD_Test::
  ~DatarateTestSVC_BasicRateTargetingFixedModeSVC3TL3SLHD_Test
            ((DatarateTestSVC_BasicRateTargetingFixedModeSVC3TL3SLHD_Test *)(this + -0x18));
  return;
}

Assistant:

TEST_P(DatarateTestSVC, BasicRateTargetingFixedModeSVC3TL3SLHD) {
  BasicRateTargetingFixedModeSVC3TL3SLHDTest();
}